

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void VCProjectWriter::outputFileConfig(VCFilter *filter,XmlOutput *xml,QString *filename)

{
  long lVar1;
  long *plVar2;
  XmlOutput *toTag;
  QString *in_RDX;
  VCFilter *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  VCFilterFile info;
  bool inBuild;
  VCCLCompilerTool *in_stack_fffffffffffffa68;
  VCCLCompilerTool *in_stack_fffffffffffffa70;
  VCFilter *this;
  QString *in_stack_fffffffffffffa88;
  undefined7 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9f;
  byte bVar3;
  xml_output *in_stack_fffffffffffffab8;
  XmlOutput *in_stack_fffffffffffffac0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)(in_RDI + 0x78) = 0;
  *(undefined1 *)(in_RDI + 0x120) = 0;
  VCCustomBuildTool::VCCustomBuildTool((VCCustomBuildTool *)in_stack_fffffffffffffa70);
  VCCustomBuildTool::operator=
            ((VCCustomBuildTool *)in_stack_fffffffffffffa70,
             (VCCustomBuildTool *)in_stack_fffffffffffffa68);
  VCCustomBuildTool::~VCCustomBuildTool((VCCustomBuildTool *)in_stack_fffffffffffffa70);
  VCCLCompilerTool::VCCLCompilerTool(in_stack_fffffffffffffa70);
  VCCLCompilerTool::operator=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  VCCLCompilerTool::~VCCLCompilerTool(in_stack_fffffffffffffa70);
  *(undefined8 *)(in_RDI + 0x118) = *(undefined8 *)(in_RDI + 0x58);
  *(undefined4 *)(in_RDI + 0x1b8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1d0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x208) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x250) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x2cc) = 5;
  QString::clear((QString *)in_stack_fffffffffffffa70);
  *(undefined4 *)(in_RDI + 0x350) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3b4) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x440) = *(undefined8 *)(in_RDI + 0x58);
  VCFilter::findFile(in_RSI,in_RDX,
                     (bool *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  this = in_RSI;
  QString::QString(&in_RSI->Name,(char *)in_RSI);
  tag(in_stack_fffffffffffffa88);
  XmlOutput::operator<<(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  QString::QString(&in_RSI->Name,(char *)this);
  attr(&in_RSI->Name,(QString *)in_stack_fffffffffffffa70);
  toTag = XmlOutput::operator<<(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  QString::QString(&in_RSI->Name,(char *)this);
  bVar3 = 1;
  attrS((char *)in_RSI,(QString *)in_stack_fffffffffffffa70);
  XmlOutput::operator<<(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffffa70);
  if ((bVar3 & 1) != 0) {
    QString::~QString((QString *)0x27da80);
  }
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffffa70);
  QString::~QString((QString *)0x27da9a);
  XmlOutput::xml_output::~xml_output((xml_output *)in_stack_fffffffffffffa70);
  QString::~QString((QString *)0x27dab4);
  if ((*(byte *)(in_RDI + 0x78) & 1) != 0) {
    plVar2 = *(long **)(*(long *)(in_RDI + 0x50) + 0x198);
    (**(code **)(*plVar2 + 0x40))(plVar2,this,in_RDI + 0x80);
  }
  if ((*(byte *)(in_RDI + 0x120) & 1) != 0) {
    plVar2 = *(long **)(*(long *)(in_RDI + 0x50) + 0x198);
    (**(code **)(*plVar2 + 0x20))(plVar2,this,in_RDI + 0x128);
  }
  QString::QString(&in_RSI->Name,(char *)this);
  closetag((QString *)toTag);
  XmlOutput::operator<<(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  XmlOutput::xml_output::~xml_output((xml_output *)this);
  QString::~QString((QString *)0x27db68);
  VCFilterFile::~VCFilterFile((VCFilterFile *)0x27db75);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::outputFileConfig(VCFilter &filter, XmlOutput &xml, const QString &filename)
{
    // Clearing each filter tool
    filter.useCustomBuildTool = false;
    filter.useCompilerTool = false;
    filter.CustomBuildTool = VCCustomBuildTool();
    filter.CompilerTool = VCCLCompilerTool();

    // Unset some default options
    filter.CustomBuildTool.config = filter.Config;
    filter.CompilerTool.BufferSecurityCheck = unset;
    filter.CompilerTool.DebugInformationFormat = debugUnknown;
    filter.CompilerTool.ExceptionHandling = ehDefault;
    filter.CompilerTool.GeneratePreprocessedFile = preprocessUnknown;
    filter.CompilerTool.Optimization = optimizeDefault;
    filter.CompilerTool.ProgramDataBaseFileName.clear();
    filter.CompilerTool.RuntimeLibrary = rtUnknown;
    filter.CompilerTool.WarningLevel = warningLevelUnknown;
    filter.CompilerTool.config = filter.Config;

    bool inBuild;
    VCFilterFile info = filter.findFile(filename, &inBuild);
    inBuild &= !info.excludeFromBuild;

    if (inBuild) {
        filter.addExtraCompiler(info);
        if(filter.Project->usePCH)
            filter.modifyPCHstage(info.file);
    } else {
        // Excluded files uses an empty compiler stage
        if(info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (filter.useCustomBuildTool || filter.useCompilerTool || !inBuild) {
        xml << tag(_FileConfiguration)
                << attr(_Name, filter.Config->Name)
                << (!inBuild ? attrS(_ExcludedFromBuild, "true") : noxml());
        if (filter.useCustomBuildTool)
            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        if (filter.useCompilerTool)
            filter.Project->projectWriter->write(xml, filter.CompilerTool);
        xml << closetag(_FileConfiguration);
    }
}